

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_3d35d4::ArgParser::argEndCopyAttachment(ArgParser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  QPDFJob::CopyAttConfig::endCopyAttachmentsFrom
            ((this->c_copy_att).
             super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this_00 = (this->c_copy_att).
            super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->c_copy_att).super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->c_copy_att).super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void
ArgParser::argEndCopyAttachment()
{
    c_copy_att->endCopyAttachmentsFrom();
    c_copy_att = nullptr;
}